

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int ly_set_rm_index(ly_set *set,uint index)

{
  uint index_local;
  ly_set *set_local;
  
  if ((set == (ly_set *)0x0) || (set->number < index + 1)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_set_rm_index");
    set_local._4_4_ = 1;
  }
  else {
    if (index == set->number - 1) {
      (set->set).s[index] = (lys_node *)0x0;
    }
    else {
      (set->set).s[index] = (set->set).s[set->number - 1];
      (set->set).s[set->number - 1] = (lys_node *)0x0;
    }
    set->number = set->number - 1;
    set_local._4_4_ = 0;
  }
  return set_local._4_4_;
}

Assistant:

API int
ly_set_rm_index(struct ly_set *set, unsigned int index)
{
    if (!set || (index + 1) > set->number) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (index == set->number - 1) {
        /* removing last item in set */
        set->set.g[index] = NULL;
    } else {
        /* removing item somewhere in a middle, so put there the last item */
        set->set.g[index] = set->set.g[set->number - 1];
        set->set.g[set->number - 1] = NULL;
    }
    set->number--;

    return EXIT_SUCCESS;
}